

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# time_zone_fixed.cc
# Opt level: O1

string * __thiscall
absl::time_internal::cctz::FixedOffsetToAbbr_abi_cxx11_
          (string *__return_storage_ptr__,cctz *this,seconds *offset)

{
  pointer pcVar1;
  
  FixedOffsetToName_abi_cxx11_(__return_storage_ptr__,this,offset);
  if (__return_storage_ptr__->_M_string_length == 0x12) {
    std::__cxx11::string::erase((ulong)__return_storage_ptr__,0);
    std::__cxx11::string::erase((ulong)__return_storage_ptr__,6);
    std::__cxx11::string::erase((ulong)__return_storage_ptr__,3);
    pcVar1 = (__return_storage_ptr__->_M_dataplus)._M_p;
    if ((pcVar1[5] == '0') && (pcVar1[6] == '0')) {
      std::__cxx11::string::erase((ulong)__return_storage_ptr__,5);
      pcVar1 = (__return_storage_ptr__->_M_dataplus)._M_p;
      if ((pcVar1[3] == '0') && (pcVar1[4] == '0')) {
        std::__cxx11::string::erase((ulong)__return_storage_ptr__,3);
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::string FixedOffsetToAbbr(const seconds& offset) {
  std::string abbr = FixedOffsetToName(offset);
  const std::size_t prefix_len = sizeof(kFixedZonePrefix) - 1;
  if (abbr.size() == prefix_len + 9) {         // <prefix>+99:99:99
    abbr.erase(0, prefix_len);                 // +99:99:99
    abbr.erase(6, 1);                          // +99:9999
    abbr.erase(3, 1);                          // +999999
    if (abbr[5] == '0' && abbr[6] == '0') {    // +999900
      abbr.erase(5, 2);                        // +9999
      if (abbr[3] == '0' && abbr[4] == '0') {  // +9900
        abbr.erase(3, 2);                      // +99
      }
    }
  }
  return abbr;
}